

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void correctstack(lua_State *L,TValue *oldstack)

{
  GCObject *local_28;
  GCObject *up;
  CallInfo *ci;
  TValue *oldstack_local;
  lua_State *L_local;
  
  L->top = L->stack + ((long)L->top - (long)oldstack >> 4);
  for (local_28 = L->openupval; local_28 != (GCObject *)0x0; local_28 = (local_28->gch).next) {
    (local_28->h).metatable =
         (Table *)(L->stack + ((long)(local_28->h).metatable - (long)oldstack >> 4));
  }
  for (up = (GCObject *)L->base_ci; up <= (GCObject *)L->ci; up = (GCObject *)&(up->h).lastfree) {
    (up->h).metatable = (Table *)(L->stack + ((long)(up->h).metatable - (long)oldstack >> 4));
    (up->gch).next = (GCObject *)(L->stack + ((long)(up->gch).next - (long)oldstack >> 4));
    *(StkId *)&(up->gch).tt = L->stack + (*(long *)&(up->gch).tt - (long)oldstack >> 4);
  }
  L->base = L->stack + ((long)L->base - (long)oldstack >> 4);
  return;
}

Assistant:

static void correctstack(lua_State*L,TValue*oldstack){
CallInfo*ci;
GCObject*up;
L->top=(L->top-oldstack)+L->stack;
for(up=L->openupval;up!=NULL;up=up->gch.next)
gco2uv(up)->v=(gco2uv(up)->v-oldstack)+L->stack;
for(ci=L->base_ci;ci<=L->ci;ci++){
ci->top=(ci->top-oldstack)+L->stack;
ci->base=(ci->base-oldstack)+L->stack;
ci->func=(ci->func-oldstack)+L->stack;
}
L->base=(L->base-oldstack)+L->stack;
}